

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall
gss::innards::Proof::incorrect_guess
          (Proof *this,vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *decisions
          ,bool failure)

{
  bool bVar1;
  type pbVar2;
  ostream *poVar3;
  size_type sVar4;
  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  key_type *__k;
  mapped_type *pmVar5;
  pointer pIVar6;
  byte in_DL;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_RSI;
  type *val;
  type *var;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff78;
  ostream *in_stack_ffffffffffffff80;
  pair<int,_int> local_60;
  pair<long,_long> local_58;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_28;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_20;
  byte local_11;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if (local_11 == 0) {
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x13fe7f);
    pbVar2 = std::
             unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          *)in_stack_ffffffffffffff80);
    poVar3 = std::operator<<(pbVar2,"* [");
    sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(local_10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    std::operator<<(poVar3,"] backtracking\n");
  }
  else {
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x13fe2a);
    pbVar2 = std::
             unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          *)in_stack_ffffffffffffff80);
    poVar3 = std::operator<<(pbVar2,"* [");
    sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(local_10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
    std::operator<<(poVar3,"] incorrect guess\n");
  }
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13fed2);
  pbVar2 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_ffffffffffffff80);
  std::operator<<(pbVar2,"u");
  local_20 = local_10;
  local_28._M_current =
       (pair<int,_int> *)
       std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                 ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                  in_stack_ffffffffffffff78);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)in_stack_ffffffffffffff78);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator*(&local_28);
    this_00 = (map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)std::get<0ul,int,int>((pair<int,_int> *)0x13ff4b);
    __k = (key_type *)std::get<1ul,int,int>((pair<int,_int> *)0x13ff5a);
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x13ff69);
    pbVar2 = std::
             unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          *)in_stack_ffffffffffffff80);
    in_stack_ffffffffffffff80 = std::operator<<(pbVar2," 1 ~x");
    pIVar6 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13ff96);
    in_stack_ffffffffffffff78 = &pIVar6->variable_mappings;
    std::pair<int,_int>::pair<int,_int,_true>(&local_60,(int *)this_00,(int *)__k);
    std::pair<long,_long>::pair<int,_int,_true>(&local_58,&local_60);
    pmVar5 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,__k);
    std::operator<<(in_stack_ffffffffffffff80,(string *)pmVar5);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&local_28);
  }
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13fff7);
  pbVar2 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_ffffffffffffff80);
  std::operator<<(pbVar2," >= 1 ;\n");
  pIVar6 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x14001f);
  pIVar6->proof_line = pIVar6->proof_line + 1;
  return;
}

Assistant:

auto Proof::incorrect_guess(const vector<pair<int, int>> & decisions, bool failure) -> void
{
    if (failure)
        *_imp->proof_stream << "* [" << decisions.size() << "] incorrect guess\n";
    else
        *_imp->proof_stream << "* [" << decisions.size() << "] backtracking\n";

    *_imp->proof_stream << "u";
    for (auto & [var, val] : decisions)
        *_imp->proof_stream << " 1 ~x" << _imp->variable_mappings[pair{var, val}];
    *_imp->proof_stream << " >= 1 ;\n";
    ++_imp->proof_line;
}